

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_avs2d_vdpu382.c
# Opt level: O1

MPP_RET hal_avs2d_vdpu382_init(void *hal,MppHalCfg *cfg)

{
  MPP_RET MVar1;
  int iVar2;
  Vdpu382RegCommon *common;
  void *pvVar3;
  void *pvVar4;
  code *val;
  ulong uVar5;
  ulong size;
  int *piVar6;
  
  if ((avs2d_hal_debug._1_1_ & 1) != 0) {
    _mpp_log_l(4,"hal_avs2d_vdpu382","In.","hal_avs2d_vdpu382_init");
  }
  if (hal == (void *)0x0) {
    MVar1 = MPP_ERR_INIT;
    if (((byte)avs2d_hal_debug & 4) != 0) {
      _mpp_log_l(4,"hal_avs2d_vdpu382","input empty(%d).\n",(char *)0x0,0x24c);
    }
  }
  else {
    pvVar3 = mpp_osal_calloc("hal_avs2d_vdpu382_init",0x6e0);
    *(void **)((long)hal + 0x5a8) = pvVar3;
    if (pvVar3 == (void *)0x0) {
      _mpp_log_l(2,"hal_avs2d_vdpu382","malloc buffer error(%d).\n","hal_avs2d_vdpu382_init",0x24e);
      MVar1 = MPP_ERR_MALLOC;
    }
    else {
      size = (ulong)(((uint)(*(int *)((long)hal + 0x5a0) != 0) * 2 + 1) * 0x2000);
      MVar1 = mpp_buffer_get_with_tag
                        (*(MppBufferGroup *)((long)hal + 0x20),(MppBuffer *)((long)pvVar3 + 0x1d8),
                         size,"hal_avs2d_vdpu382","hal_avs2d_vdpu382_init");
      if (MPP_NOK < MVar1) {
        iVar2 = mpp_buffer_get_fd_with_caller
                          (*(MppBuffer *)((long)pvVar3 + 0x1d8),"hal_avs2d_vdpu382_init");
        *(int *)((long)pvVar3 + 0x1e0) = iVar2;
        pvVar4 = mpp_buffer_get_ptr_with_caller
                           (*(MppBuffer *)((long)pvVar3 + 0x1d8),"hal_avs2d_vdpu382_init");
        *(void **)((long)pvVar3 + 0x1e8) = pvVar4;
        piVar6 = (int *)((long)pvVar3 + 4);
        uVar5 = 0;
        do {
          pvVar4 = mpp_osal_calloc("hal_avs2d_vdpu382_init",0x2a4);
          *(void **)(piVar6 + 3) = pvVar4;
          *(uint *)((long)pvVar4 + 4) = *(uint *)((long)pvVar4 + 4) & 0xfffffc00 | 3;
          *(byte *)((long)pvVar4 + 0x1c) = *(byte *)((long)pvVar4 + 0x1c) & 0xfd;
          *(byte *)((long)pvVar4 + 8) = *(byte *)((long)pvVar4 + 8) | 1;
          *(byte *)((long)pvVar4 + 0x34) = *(byte *)((long)pvVar4 + 0x34) & 0xf8;
          *(undefined4 *)((long)pvVar4 + 0x40) = 0xffffffdf;
          *(uint *)((long)pvVar4 + 0x44) = *(uint *)((long)pvVar4 + 0x44) & 0xc0000000 | 0x3dffffff;
          *(uint *)((long)pvVar4 + 0x48) = *(uint *)((long)pvVar4 + 0x48) | 0x80030f1f;
          *(undefined4 *)((long)pvVar4 + 0x60) = 0x3fffff;
          *(uint *)((long)pvVar4 + 0xc) = *(uint *)((long)pvVar4 + 0xc) | 0xc00042;
          *(uint *)((long)pvVar4 + 0x14) = *(uint *)((long)pvVar4 + 0x14) & 0xfffbffff | 0x40;
          *(uint *)((long)pvVar4 + 0x10) = *(uint *)((long)pvVar4 + 0x10) & 0xffffff9d | 0x42;
          *piVar6 = (int)uVar5;
          piVar6[1] = (int)uVar5 + 0x1000;
          piVar6 = piVar6 + 6;
          uVar5 = uVar5 + 0x2000;
        } while (size != uVar5);
        if (*(int *)((long)hal + 0x5a0) == 0) {
          *(undefined8 *)((long)pvVar3 + 0x50) = *(undefined8 *)((long)pvVar3 + 0x10);
          *(undefined8 *)((long)pvVar3 + 0x48) = *(undefined8 *)((long)pvVar3 + 4);
        }
        val = avs2d_hor_align_64;
        if (((cfg->cfg->base).out_fmt & 0xf00000) == MPP_FMT_YUV420SP) {
          val = avs2d_hor_align;
        }
        mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x10),SLOTS_HOR_ALIGN,val);
        mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x10),SLOTS_HOR_ALIGN,avs2d_hor_align);
        mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x10),SLOTS_VER_ALIGN,avs2d_ver_align);
        mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x10),SLOTS_LEN_ALIGN,avs2d_len_align);
        goto LAB_001e9b39;
      }
      if (((byte)avs2d_hal_debug & 4) != 0) {
        _mpp_log_l(4,"hal_avs2d_vdpu382","Function error(%d).\n",(char *)0x0,0x253);
      }
    }
    hal_avs2d_vdpu382_deinit(hal);
  }
LAB_001e9b39:
  if ((avs2d_hal_debug._1_1_ & 1) != 0) {
    _mpp_log_l(4,"hal_avs2d_vdpu382","Out. ret %d","hal_avs2d_vdpu382_init",(ulong)(uint)MVar1);
  }
  return MVar1;
}

Assistant:

MPP_RET hal_avs2d_vdpu382_init(void *hal, MppHalCfg *cfg)
{
    MPP_RET ret = MPP_OK;
    RK_U32 i, loop;
    Avs2dVdpu382RegCtx_t *reg_ctx;
    Avs2dHalCtx_t *p_hal = (Avs2dHalCtx_t *)hal;

    AVS2D_HAL_TRACE("In.");

    INP_CHECK(ret, NULL == p_hal);

    MEM_CHECK(ret, p_hal->reg_ctx = mpp_calloc_size(void, sizeof(Avs2dVdpu382RegCtx_t)));
    reg_ctx = (Avs2dVdpu382RegCtx_t *)p_hal->reg_ctx;

    //!< malloc buffers
    loop = p_hal->fast_mode ? MPP_ARRAY_ELEMS(reg_ctx->reg_buf) : 1;
    FUN_CHECK(ret = mpp_buffer_get(p_hal->buf_group, &reg_ctx->bufs, AVS2_ALL_TBL_BUF_SIZE(loop)));
    reg_ctx->bufs_fd = mpp_buffer_get_fd(reg_ctx->bufs);
    reg_ctx->bufs_ptr = mpp_buffer_get_ptr(reg_ctx->bufs);

    for (i = 0; i < loop; i++) {
        reg_ctx->reg_buf[i].regs = mpp_calloc(Vdpu382Avs2dRegSet, 1);
        init_common_regs(reg_ctx->reg_buf[i].regs);
        reg_ctx->reg_buf[i].offset_shph = AVS2_SHPH_OFFSET(i);
        reg_ctx->reg_buf[i].offset_sclst = AVS2_SCALIST_OFFSET(i);
    }

    if (!p_hal->fast_mode) {
        reg_ctx->regs = reg_ctx->reg_buf[0].regs;
        reg_ctx->shph_offset = reg_ctx->reg_buf[0].offset_shph;
        reg_ctx->sclst_offset = reg_ctx->reg_buf[0].offset_sclst;
    }

    if (MPP_FRAME_FMT_IS_FBC(cfg->cfg->base.out_fmt))
        mpp_slots_set_prop(p_hal->frame_slots, SLOTS_HOR_ALIGN, avs2d_hor_align_64);
    else
        mpp_slots_set_prop(p_hal->frame_slots, SLOTS_HOR_ALIGN, avs2d_hor_align);

    mpp_slots_set_prop(p_hal->frame_slots, SLOTS_HOR_ALIGN, avs2d_hor_align);
    mpp_slots_set_prop(p_hal->frame_slots, SLOTS_VER_ALIGN, avs2d_ver_align);
    mpp_slots_set_prop(p_hal->frame_slots, SLOTS_LEN_ALIGN, avs2d_len_align);

__RETURN:
    AVS2D_HAL_TRACE("Out. ret %d", ret);
    (void)cfg;
    return ret;
__FAILED:
    hal_avs2d_vdpu382_deinit(p_hal);
    AVS2D_HAL_TRACE("Out. ret %d", ret);
    return ret;
}